

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_do_button_text_image
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,char *str,int len,
              nk_flags align,nk_button_behavior behavior,nk_style_button *style,nk_user_font *font,
              nk_input *in)

{
  nk_vec2 nVar1;
  uint state_00;
  int iVar2;
  nk_style_item *pnVar3;
  nk_color *pnVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  nk_rect r;
  undefined8 local_a8;
  nk_text local_88;
  undefined1 local_78 [16];
  nk_vec2 local_68;
  undefined8 uStack_60;
  nk_rect content;
  nk_rect bounds_local;
  
  local_68.y = bounds.y;
  bounds_local = bounds;
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4d68,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4d69,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4d6a,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4d6b,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (str == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    local_68.x = local_68.y;
    uStack_60 = CONCAT44(local_68.y,local_68.y);
    local_78._8_4_ = in_XMM1_Dc;
    local_78._0_8_ = bounds._8_8_;
    local_78._12_4_ = in_XMM1_Dd;
    iVar2 = nk_do_button(state,out,bounds,style,in,behavior,&content);
    fVar6 = (style->padding).y;
    fVar7 = local_68.x + fVar6;
    fVar6 = bounds.h - (fVar6 + fVar6);
    local_a8._0_4_ = bounds.x;
    if ((align & 1) == 0) {
      fVar5 = (style->padding).x;
      fVar5 = fVar5 + fVar5 + (float)local_a8;
    }
    else {
      fVar5 = (style->padding).x;
      fVar9 = ((float)local_78._0_4_ + (float)local_a8) - (fVar5 + fVar5 + fVar6);
      fVar5 = 0.0;
      if (0.0 <= fVar9) {
        fVar5 = fVar9;
      }
    }
    nVar1 = style->image_padding;
    fVar9 = nVar1.x;
    fVar8 = nVar1.y;
    fVar10 = fVar9 + fVar9;
    fVar11 = fVar8 + fVar8;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      uStack_60 = 0;
      local_78._4_4_ = fVar8 + fVar8;
      local_78._0_4_ = fVar9 + fVar9;
      local_78._8_8_ = 0;
      local_68 = nVar1;
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      fVar9 = local_68.x;
      fVar8 = local_68.y;
      fVar10 = (float)local_78._0_4_;
      fVar11 = (float)local_78._4_4_;
    }
    r.w = fVar6 - fVar10;
    r.h = fVar6 - fVar11;
    state_00 = *state;
    pnVar3 = nk_draw_button(out,&bounds_local,state_00,style);
    pnVar4 = &style->text_background;
    if (pnVar3->type == NK_STYLE_ITEM_COLOR) {
      pnVar4 = (nk_color *)&pnVar3->data;
    }
    local_88.background = *pnVar4;
    if ((state_00 & 0x10) == 0) {
      if ((state_00 & 0x20) == 0) {
        local_88.text = style->text_normal;
      }
      else {
        local_88.text = style->text_active;
      }
    }
    else {
      local_88.text = style->text_hover;
    }
    local_88.padding.x = 0.0;
    local_88.padding.y = 0.0;
    nk_widget_text(out,content,str,len,&local_88,0x12,font);
    r.x = fVar5 + fVar9;
    r.y = fVar7 + fVar8;
    nk_draw_image(out,r,&img,(nk_color)0xffffffff);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return iVar2;
}

Assistant:

NK_LIB int
nk_do_button_text_image(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    struct nk_image img, const char* str, int len, nk_flags align,
    enum nk_button_behavior behavior, const struct nk_style_button *style,
    const struct nk_user_font *font, const struct nk_input *in)
{
    int ret;
    struct nk_rect icon;
    struct nk_rect content;

    NK_ASSERT(style);
    NK_ASSERT(state);
    NK_ASSERT(font);
    NK_ASSERT(out);
    if (!out || !font || !style || !str)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    icon.y = bounds.y + style->padding.y;
    icon.w = icon.h = bounds.h - 2 * style->padding.y;
    if (align & NK_TEXT_ALIGN_LEFT) {
        icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
        icon.x = NK_MAX(icon.x, 0);
    } else icon.x = bounds.x + 2 * style->padding.x;

    icon.x += style->image_padding.x;
    icon.y += style->image_padding.y;
    icon.w -= 2 * style->image_padding.x;
    icon.h -= 2 * style->image_padding.y;

    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text_image(out, &bounds, &content, &icon, *state, style, str, len, font, &img);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}